

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGIsNullable(xmlRelaxNGDefinePtr_conflict define)

{
  xmlRelaxNGDefinePtr_conflict pxVar1;
  int iVar2;
  ushort uVar3;
  xmlRelaxNGDefinePtr *ppxVar4;
  
  iVar2 = -1;
  if (define == (xmlRelaxNGDefinePtr_conflict)0x0) {
    return -1;
  }
  uVar3 = define->dflags;
  if ((uVar3 & 1) != 0) {
    return 1;
  }
  if ((uVar3 & 2) != 0) {
    return 0;
  }
  switch(define->type) {
  case XML_RELAXNG_EMPTY:
  case XML_RELAXNG_TEXT:
    goto switchD_00173a33_caseD_0;
  case XML_RELAXNG_NOT_ALLOWED:
  case XML_RELAXNG_EXCEPT:
  case XML_RELAXNG_ELEMENT:
  case XML_RELAXNG_DATATYPE:
  case XML_RELAXNG_PARAM:
  case XML_RELAXNG_VALUE:
  case XML_RELAXNG_LIST:
  case XML_RELAXNG_ATTRIBUTE:
    goto switchD_00173a33_caseD_1;
  default:
    goto switchD_00173a33_caseD_e;
  case XML_RELAXNG_CHOICE:
    ppxVar4 = &define->content;
    do {
      pxVar1 = *ppxVar4;
      if (pxVar1 == (xmlRelaxNGDefinePtr_conflict)0x0) goto switchD_00173a33_caseD_1;
      iVar2 = xmlRelaxNGIsNullable(pxVar1);
      ppxVar4 = &pxVar1->next;
    } while (iVar2 == 0);
    break;
  case XML_RELAXNG_GROUP:
  case XML_RELAXNG_INTERLEAVE:
  case XML_RELAXNG_START:
    ppxVar4 = &define->content;
    do {
      pxVar1 = *ppxVar4;
      if (pxVar1 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return 1;
      }
      iVar2 = xmlRelaxNGIsNullable(pxVar1);
      ppxVar4 = &pxVar1->next;
    } while (iVar2 == 1);
    break;
  case XML_RELAXNG_NOOP:
  case XML_RELAXNG_DEF:
  case XML_RELAXNG_REF:
  case XML_RELAXNG_EXTERNALREF:
  case XML_RELAXNG_PARENTREF:
  case XML_RELAXNG_ONEORMORE:
    iVar2 = xmlRelaxNGIsNullable(define->content);
  }
  if (iVar2 == 0) {
switchD_00173a33_caseD_1:
    uVar3 = define->dflags | 2;
    iVar2 = 0;
  }
  else {
    if (iVar2 != 1) {
      return iVar2;
    }
    uVar3 = define->dflags;
switchD_00173a33_caseD_0:
    uVar3 = uVar3 | 1;
    iVar2 = 1;
  }
  define->dflags = uVar3;
switchD_00173a33_caseD_e:
  return iVar2;
}

Assistant:

static int
xmlRelaxNGIsNullable(xmlRelaxNGDefinePtr define)
{
    int ret;

    if (define == NULL)
        return (-1);

    if (define->dflags & IS_NULLABLE)
        return (1);
    if (define->dflags & IS_NOT_NULLABLE)
        return (0);
    switch (define->type) {
        case XML_RELAXNG_EMPTY:
        case XML_RELAXNG_TEXT:
            ret = 1;
            break;
        case XML_RELAXNG_NOOP:
        case XML_RELAXNG_DEF:
        case XML_RELAXNG_REF:
        case XML_RELAXNG_EXTERNALREF:
        case XML_RELAXNG_PARENTREF:
        case XML_RELAXNG_ONEORMORE:
            ret = xmlRelaxNGIsNullable(define->content);
            break;
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_NOT_ALLOWED:
        case XML_RELAXNG_ELEMENT:
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_PARAM:
        case XML_RELAXNG_VALUE:
        case XML_RELAXNG_LIST:
        case XML_RELAXNG_ATTRIBUTE:
            ret = 0;
            break;
        case XML_RELAXNG_CHOICE:{
                xmlRelaxNGDefinePtr list = define->content;

                while (list != NULL) {
                    ret = xmlRelaxNGIsNullable(list);
                    if (ret != 0)
                        goto done;
                    list = list->next;
                }
                ret = 0;
                break;
            }
        case XML_RELAXNG_START:
        case XML_RELAXNG_INTERLEAVE:
        case XML_RELAXNG_GROUP:{
                xmlRelaxNGDefinePtr list = define->content;

                while (list != NULL) {
                    ret = xmlRelaxNGIsNullable(list);
                    if (ret != 1)
                        goto done;
                    list = list->next;
                }
                return (1);
            }
        default:
            return (-1);
    }
  done:
    if (ret == 0)
        define->dflags |= IS_NOT_NULLABLE;
    if (ret == 1)
        define->dflags |= IS_NULLABLE;
    return (ret);
}